

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_brand_code(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  undefined8 *v;
  
  pcVar1 = parser_getstr(p,"code");
  pvVar2 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0x38);
  v[6] = pvVar2;
  parser_setpriv(p,v);
  pcVar1 = string_make(pcVar1);
  *v = pcVar1;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_brand_code(struct parser *p) {
	const char *code = parser_getstr(p, "code");
	struct brand *h = parser_priv(p);
	struct brand *brand = mem_zalloc(sizeof *brand);

	brand->next = h;
	parser_setpriv(p, brand);
	brand->code = string_make(code);
	return PARSE_ERROR_NONE;
}